

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O0

ASTRefCount<antlr::AST> * __thiscall
antlr::ASTRefCount<antlr::AST>::operator=
          (ASTRefCount<antlr::AST> *this,ASTRefCount<antlr::AST> *other)

{
  bool bVar1;
  long *in_RSI;
  ASTRefCount<antlr::AST> *in_RDI;
  ASTRef *tmp;
  ASTRef *this_00;
  ASTRef *local_28;
  
  if ((ASTRef *)*in_RSI != in_RDI->ref) {
    if (*in_RSI == 0) {
      local_28 = (ASTRef *)0x0;
    }
    else {
      local_28 = ASTRef::increment((ASTRef *)*in_RSI);
    }
    if (((in_RDI->ref != (ASTRef *)0x0) && (bVar1 = ASTRef::decrement(in_RDI->ref), bVar1)) &&
       (this_00 = in_RDI->ref, this_00 != (ASTRef *)0x0)) {
      ASTRef::~ASTRef(this_00);
      operator_delete(this_00,0x10);
    }
    in_RDI->ref = local_28;
  }
  return in_RDI;
}

Assistant:

ASTRefCount<T>& operator=(const ASTRefCount<T>& other)
	{
		if( other.ref != ref )
		{
			ASTRef* tmp = other.ref ? other.ref->increment() : 0;

			if (ref && ref->decrement())
				delete ref;

			ref=tmp;
		}
		return *this;
	}